

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_v3.cc
# Opt level: O1

int X509v3_get_ext_by_OBJ(stack_st_X509_EXTENSION *x,ASN1_OBJECT *obj,int lastpos)

{
  int iVar1;
  size_t sVar2;
  undefined8 *puVar3;
  int iVar4;
  ulong uVar5;
  ulong i;
  
  if (x == (stack_st_X509_EXTENSION *)0x0) {
LAB_00221e27:
    iVar4 = -1;
  }
  else {
    sVar2 = OPENSSL_sk_num((OPENSSL_STACK *)x);
    if (lastpos < 0) {
      lastpos = 0xffffffff;
    }
    uVar5 = (ulong)(uint)lastpos;
    i = (ulong)lastpos;
    do {
      i = i + 1;
      if ((long)(int)sVar2 <= (long)i) goto LAB_00221e27;
      puVar3 = (undefined8 *)OPENSSL_sk_value((OPENSSL_STACK *)x,i);
      iVar1 = OBJ_cmp((ASN1_OBJECT *)*puVar3,obj);
      if (iVar1 == 0) {
        uVar5 = i & 0xffffffff;
      }
      iVar4 = (int)uVar5;
    } while (iVar1 != 0);
  }
  return iVar4;
}

Assistant:

int X509v3_get_ext_by_OBJ(const STACK_OF(X509_EXTENSION) *sk,
                          const ASN1_OBJECT *obj, int lastpos) {
  if (sk == NULL) {
    return -1;
  }
  lastpos++;
  if (lastpos < 0) {
    lastpos = 0;
  }
  int n = (int)sk_X509_EXTENSION_num(sk);
  for (; lastpos < n; lastpos++) {
    const X509_EXTENSION *ex = sk_X509_EXTENSION_value(sk, lastpos);
    if (OBJ_cmp(ex->object, obj) == 0) {
      return lastpos;
    }
  }
  return -1;
}